

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

version_type __thiscall pstore::uuid::version(uuid *this)

{
  byte bVar1;
  byte *pbVar2;
  uuid *this_local;
  
  pbVar2 = std::array<unsigned_char,_16UL>::operator[](&this->data_,6);
  bVar1 = *pbVar2 & 0xf0;
  if (bVar1 == 0x10) {
    this_local._4_4_ = time_based;
  }
  else if (bVar1 == 0x20) {
    this_local._4_4_ = dce_security;
  }
  else if (bVar1 == 0x30) {
    this_local._4_4_ = name_based_md5;
  }
  else if (bVar1 == 0x40) {
    this_local._4_4_ = random_number_based;
  }
  else if (bVar1 == 0x50) {
    this_local._4_4_ = name_based_sha1;
  }
  else {
    this_local._4_4_ = unknown;
  }
  return this_local._4_4_;
}

Assistant:

auto uuid::version () const noexcept -> version_type {
        switch (data_[version_octet] & 0xF0) {
        case 0x10: return version_type::time_based;
        case 0x20: return version_type::dce_security;
        case 0x30: return version_type::name_based_md5;
        case 0x40: return version_type::random_number_based;
        case 0x50: return version_type::name_based_sha1;
        default: return version_type::unknown;
        }
    }